

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> __thiscall
mjs::parser::parse(parser *this)

{
  parser *in_RSI;
  statement_list l;
  ostringstream oss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  undefined4 local_188;
  undefined4 local_184;
  
  l.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  l.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  l.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  skip_whitespace(in_RSI);
  parse_statement_list((statement_list *)&oss,in_RSI,1 < (int)in_RSI->version_);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::_M_move_assign(&l,&oss);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             *)&oss);
  expect_semicolon_allow_insertion(in_RSI,"parse",0x101);
  std::__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> *)&oss,
             (__shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> *)in_RSI);
  local_188 = 0;
  local_184 = (undefined4)(in_RSI->lexer_).text_pos_;
  std::
  make_unique<mjs::block_statement,mjs::source_extend,std::vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>,bool&>
            ((source_extend *)this,
             (vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
              *)&oss,(bool *)&l);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector(&l);
  return (__uniq_ptr_data<mjs::block_statement,_std::default_delete<mjs::block_statement>,_true,_true>
          )(__uniq_ptr_data<mjs::block_statement,_std::default_delete<mjs::block_statement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<block_statement> parse() {

#ifdef PARSER_DEBUG
        std::wcout << "\nParsing '" << source_->text() << "'\n\n";
#endif

        statement_list l;

        try {
            skip_whitespace();
            l = parse_statement_list(version_ >= version::es5);
            EXPECT_SEMICOLON_ALLOW_INSERTION();
        } catch (const std::exception& e) {
            std::ostringstream oss;
            oss << source_extend{source_, token_start_, lexer_.text_position()} << ": " << e.what();
            throw std::runtime_error(oss.str());
        }

#ifdef PARSER_DEBUG
        std::wcout << "\n\n";
#endif
        return std::make_unique<block_statement>(source_extend{source_, 0, lexer_.text_position()}, std::move(l), strict_mode_);
    }